

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O2

string_t * __thiscall
cfgfile::
tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::print(string_t *__return_storage_ptr__,
       tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
       *this,int indent)

{
  pointer pbVar1;
  undefined8 *puVar2;
  tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *ptVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  pointer pbVar7;
  undefined8 *puVar8;
  string_t value;
  string_t local_80;
  long local_60;
  tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
  *local_58;
  string_t local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar4 = tag_t<cfgfile::string_trait_t>::is_defined(&this->super_tag_t<cfgfile::string_trait_t>);
  if (bVar4) {
    local_60 = (long)indent;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_80,(char)indent);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_80);
    cVar6 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    pbVar1 = (this->m_values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_58 = this;
    for (pbVar7 = (this->m_values).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ptVar3 = local_58, pbVar7 != pbVar1;
        pbVar7 = pbVar7 + 1) {
      std::__cxx11::string::push_back(cVar6);
      std::__cxx11::string::string((string *)&local_80,(string *)pbVar7);
      to_cfgfile_format<cfgfile::string_trait_t>(&local_50,&local_80);
      std::__cxx11::string::operator=((string *)&local_80,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_80);
    }
    iVar5 = (*(local_58->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(local_58);
    if (*(long *)CONCAT44(extraout_var,iVar5) != ((long *)CONCAT44(extraout_var,iVar5))[1]) {
      std::__cxx11::string::push_back(cVar6);
      iVar5 = (*(ptVar3->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(ptVar3);
      puVar2 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_00,iVar5))[1];
      for (puVar8 = *(undefined8 **)CONCAT44(extraout_var_00,iVar5); puVar8 != puVar2;
          puVar8 = puVar8 + 1) {
        (**(code **)(*(long *)*puVar8 + 0x18))(&local_80,(long *)*puVar8,indent + 1);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_80);
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_80,(char)local_60);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Trait::string_t print( int indent = 0 ) const override
	{
		typename Trait::string_t result;

		if( this->is_defined() )
		{
			result.append( typename Trait::string_t( indent,
				const_t< Trait >::c_tab ) );
			result.push_back( const_t< Trait >::c_begin_tag );
			result.append( this->name() );

			for( const T & v : m_values )
			{
				result.push_back( const_t< Trait >::c_space );

				typename Trait::string_t value =
					format_t< T, Trait >::to_string( v );

				value = to_cfgfile_format< Trait >( value );

				result.append( value );
			}

			if( !this->children().empty() )
			{
				result.push_back( const_t< Trait >::c_carriage_return );

				for( const tag_t< Trait > * tag : this->children() )
					result.append( tag->print( indent + 1 ) );

				result.append( typename Trait::string_t( indent,
					const_t< Trait >::c_tab ) );
			}

			result.push_back( const_t< Trait >::c_end_tag );
			result.push_back( const_t< Trait >::c_carriage_return );
		}

		return result;
	}